

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  undefined8 *puVar2;
  int *piVar3;
  int32_t *piVar4;
  int32_t *piVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  int32_t iVar20;
  int32_t iVar21;
  int32_t iVar22;
  uint uVar23;
  int iVar24;
  code *pcVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  int32_t *piVar30;
  ulong uVar31;
  uint uVar32;
  int32_t *piVar33;
  __m128i *output_00;
  uint instride;
  ulong uVar34;
  __m128i *input_00;
  __m128i round;
  undefined1 auVar35 [16];
  int col_size;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [4096];
  TXFM_2D_FLIP_CFG local_4078;
  undefined8 local_4038;
  int aiStack_4030 [2];
  int32_t aiStack_4028 [4094];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x04',&local_4078);
  uVar6 = tx_size_wide[local_4078.tx_size];
  uVar34 = (ulong)uVar6;
  if (local_4078.txfm_type_col == '\x03') {
    pcVar25 = fdct32_sse4_1;
  }
  else if (local_4078.txfm_type_col == '\v') {
    pcVar25 = idtx32x32_sse4_1;
  }
  else if (local_4078.txfm_type_col == '\x04') {
    pcVar25 = fdct64_new_sse4_1;
  }
  else {
    pcVar25 = (code *)0x0;
  }
  uVar32 = uVar6 * uVar6;
  uVar29 = 0;
  piVar30 = output;
  do {
    uVar31 = 0;
    do {
      piVar30[uVar31] = (int)input[uVar31];
      uVar31 = uVar31 + 1;
    } while (uVar34 != uVar31);
    uVar29 = uVar29 + 1;
    piVar30 = piVar30 + uVar34;
    input = input + stride;
  } while (uVar29 != uVar34);
  uVar23 = uVar6 + 3;
  if (-1 < (int)uVar6) {
    uVar23 = uVar6;
  }
  instride = (int)uVar23 >> 2;
  uVar29 = (ulong)instride;
  input_00 = (__m128i *)&local_4038;
  (*pcVar25)(output,input_00,(int)local_4078.cos_bit_col);
  iVar26 = (int)local_4078.shift[1];
  if (iVar26 < 0) {
    if (3 < uVar32) {
      iVar24 = 1 << (~local_4078.shift[1] & 0x1fU);
      uVar31 = (ulong)(uVar32 >> 2);
      lVar27 = 0;
      auVar35 = ZEXT416((uint)-iVar26);
      do {
        iVar26 = *(int *)((long)aiStack_4030 + lVar27 + -4);
        iVar7 = *(int *)((long)aiStack_4030 + lVar27);
        iVar8 = *(int *)((long)aiStack_4028 + lVar27 + -4);
        piVar1 = (int *)((long)output + lVar27);
        *piVar1 = *(int *)((long)&local_4038 + lVar27) + iVar24 >> auVar35;
        piVar1[1] = iVar26 + iVar24 >> auVar35;
        piVar1[2] = iVar7 + iVar24 >> auVar35;
        piVar1[3] = iVar8 + iVar24 >> auVar35;
        lVar27 = lVar27 + 0x10;
        uVar31 = uVar31 - 1;
      } while (uVar31 != 0);
    }
  }
  else if (3 < uVar32) {
    uVar31 = (ulong)(uVar32 >> 2);
    lVar27 = 0;
    do {
      iVar24 = *(int *)((long)aiStack_4030 + lVar27 + -4);
      iVar7 = *(int *)((long)aiStack_4030 + lVar27);
      iVar8 = *(int *)((long)aiStack_4028 + lVar27 + -4);
      piVar1 = (int *)((long)output + lVar27);
      *piVar1 = *(int *)((long)&local_4038 + lVar27) << iVar26;
      piVar1[1] = iVar24;
      piVar1[2] = iVar7;
      piVar1[3] = iVar8;
      lVar27 = lVar27 + 0x10;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  uVar31 = 0;
  piVar30 = output;
  do {
    iVar26 = 0;
    uVar28 = uVar29;
    piVar33 = piVar30;
    do {
      lVar27 = (long)iVar26 * 0x10 + uVar31 * 4 + -0x4038;
      iVar9 = piVar33[1];
      iVar10 = piVar33[2];
      iVar11 = piVar33[3];
      piVar4 = piVar33 + (ulong)(instride * 2) * 4;
      iVar12 = *piVar4;
      iVar13 = piVar4[1];
      iVar14 = piVar4[2];
      iVar15 = piVar4[3];
      piVar4 = piVar33 + uVar29 * 4;
      iVar16 = piVar4[1];
      iVar17 = piVar4[2];
      iVar18 = piVar4[3];
      piVar5 = piVar33 + (ulong)(instride * 3) * 4;
      iVar19 = *piVar5;
      iVar20 = piVar5[1];
      iVar21 = piVar5[2];
      iVar22 = piVar5[3];
      puVar2 = (undefined8 *)((long)&local_4038 + (long)iVar26 * 0x10 + uVar31 * 4);
      *puVar2 = CONCAT44(*piVar4,*piVar33);
      *(int32_t *)(puVar2 + 2) = iVar12;
      *(int32_t *)((long)puVar2 + 0x14) = iVar19;
      piVar4 = (int32_t *)((long)&local_4038 + uVar29 * 0x10 + lVar27 + 0x4038);
      *piVar4 = iVar9;
      piVar4[1] = iVar16;
      piVar4[2] = iVar13;
      piVar4[3] = iVar20;
      puVar2 = (undefined8 *)((long)&local_4038 + (ulong)(instride * 2) * 0x10 + lVar27 + 0x4038);
      *puVar2 = CONCAT44(iVar17,iVar10);
      *(int32_t *)(puVar2 + 2) = iVar14;
      *(int32_t *)((long)puVar2 + 0x14) = iVar21;
      piVar4 = (int32_t *)((long)&local_4038 + (ulong)(instride * 3) * 0x10 + lVar27 + 0x4038);
      *piVar4 = iVar11;
      piVar4[1] = iVar18;
      piVar4[2] = iVar15;
      piVar4[3] = iVar22;
      iVar26 = iVar26 + instride * 4;
      piVar33 = piVar33 + 4;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
    uVar31 = uVar31 + 4;
    piVar30 = piVar30 + uVar29 * 0x10;
  } while (uVar31 < uVar34);
  uVar23 = (int)uVar23 >> 3;
  if (0 < (int)uVar23) {
    uVar34 = (ulong)uVar23;
    output_00 = (__m128i *)output;
    do {
      av1_fdct64_sse4_1(input_00,output_00,local_4078.cos_bit_row,instride,uVar23);
      output_00 = output_00 + 1;
      input_00 = input_00 + 1;
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
  }
  uVar23 = uVar23 * ((int)uVar6 >> 1);
  iVar26 = (int)local_4078.shift[2];
  if (iVar26 < 0) {
    if (0 < (int)uVar23) {
      iVar24 = 1 << (~local_4078.shift[2] & 0x1fU);
      lVar27 = 0;
      auVar35 = ZEXT416((uint)-iVar26);
      do {
        piVar1 = (int *)((long)output + lVar27);
        iVar26 = piVar1[1];
        iVar7 = piVar1[2];
        iVar8 = piVar1[3];
        piVar3 = (int *)((long)output + lVar27);
        *piVar3 = *piVar1 + iVar24 >> auVar35;
        piVar3[1] = iVar26 + iVar24 >> auVar35;
        piVar3[2] = iVar7 + iVar24 >> auVar35;
        piVar3[3] = iVar8 + iVar24 >> auVar35;
        lVar27 = lVar27 + 0x10;
      } while ((ulong)uVar23 << 4 != lVar27);
    }
  }
  else if (0 < (int)uVar23) {
    lVar27 = 0;
    do {
      piVar1 = (int *)((long)output + lVar27);
      iVar24 = piVar1[1];
      iVar7 = piVar1[2];
      iVar8 = piVar1[3];
      piVar3 = (int *)((long)output + lVar27);
      *piVar3 = *piVar1 << iVar26;
      piVar3[1] = iVar24;
      piVar3[2] = iVar7;
      piVar3[3] = iVar8;
      lVar27 = lVar27 + 0x10;
    } while ((ulong)uVar23 << 4 != lVar27);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[4096]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X64, &cfg);
  (void)bd;
  fwd_txfm2d_64x64_sse4_1(input, output, stride, &cfg, txfm_buf);
}